

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::CreateNested
          (ParseInfoTree *this,FieldDescriptor *field)

{
  ParseInfoTree *this_00;
  mapped_type *this_01;
  FieldDescriptor *field_local;
  ParseInfoTree *instance;
  
  field_local = field;
  this_00 = (ParseInfoTree *)operator_new(0x60);
  ParseInfoTree(this_00);
  instance = this_00;
  this_01 = std::
            map<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>_>_>
            ::operator[](&this->nested_,&field_local);
  std::
  vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
  ::push_back(this_01,&instance);
  return instance;
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::CreateNested(
    const FieldDescriptor* field) {
  // Owned by us in the map.
  TextFormat::ParseInfoTree* instance = new TextFormat::ParseInfoTree();
  vector<TextFormat::ParseInfoTree*>* trees = &nested_[field];
  GOOGLE_CHECK(trees);
  trees->push_back(instance);
  return instance;
}